

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rb_generator.cc
# Opt level: O1

void __thiscall t_rb_generator::~t_rb_generator(t_rb_generator *this)

{
  pointer pcVar1;
  
  (this->super_t_oop_generator).super_t_generator._vptr_t_generator =
       (_func_int **)&PTR__t_rb_generator_00411878;
  pcVar1 = (this->require_prefix_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->require_prefix_).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->namespace_dir_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->namespace_dir_).field_2) {
    operator_delete(pcVar1);
  }
  (this->f_service_).super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
  _vptr_basic_ostream = (_func_int **)0x411ad8;
  *(undefined8 *)
   &(this->f_service_).super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x100
       = 0x411b00;
  std::filebuf::~filebuf
            ((filebuf *)
             &(this->f_service_).super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
              field_0x8);
  std::ios_base::~ios_base
            ((ios_base *)
             &(this->f_service_).super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
              field_0x100);
  (this->f_consts_).super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
  _vptr_basic_ostream = (_func_int **)0x411ad8;
  *(undefined8 *)
   &(this->f_consts_).super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x100
       = 0x411b00;
  std::filebuf::~filebuf
            ((filebuf *)
             &(this->f_consts_).super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
              field_0x8);
  std::ios_base::~ios_base
            ((ios_base *)
             &(this->f_consts_).super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
              field_0x100);
  (this->f_types_).super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
  _vptr_basic_ostream = (_func_int **)0x411ad8;
  *(undefined8 *)
   &(this->f_types_).super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x100 =
       0x411b00;
  std::filebuf::~filebuf
            ((filebuf *)
             &(this->f_types_).super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
              field_0x8);
  std::ios_base::~ios_base
            ((ios_base *)
             &(this->f_types_).super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
              field_0x100);
  t_generator::~t_generator((t_generator *)this);
  return;
}

Assistant:

t_rb_generator(t_program* program,
                 const std::map<std::string, std::string>& parsed_options,
                 const std::string& option_string)
    : t_oop_generator(program) {
    (void)option_string;
    std::map<std::string, std::string>::const_iterator iter;

    require_rubygems_ = false;
    namespaced_ = false;
    for( iter = parsed_options.begin(); iter != parsed_options.end(); ++iter) {
      if( iter->first.compare("rubygems") == 0) {
        require_rubygems_ = true;
      } else if( iter->first.compare("namespaced") == 0) {
        namespaced_ = true;
      } else {
        throw "unknown option ruby:" + iter->first;
      }
    }

    out_dir_base_ = "gen-rb";
  }